

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void GEO::Process::show_stats(void)

{
  ostream *poVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  size_t mem_M;
  string s;
  size_t mem_K;
  size_t mem_G;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  ulong local_58;
  string local_50;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  std::__cxx11::string::string((string *)&local_50,"Process",(allocator *)&bStack_98);
  poVar1 = Logger::out(&local_50);
  std::operator<<(poVar1,"Total elapsed time: ");
  dVar5 = SystemStopwatch::now();
  poVar1 = std::ostream::_M_insert<double>(dVar5 - ::(anonymous_namespace)::start_time_);
  poVar1 = std::operator<<(poVar1,"s");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_50);
  sVar2 = os_max_used_memory();
  local_28 = sVar2 >> 0x1e;
  local_58 = (ulong)((uint)(sVar2 >> 0x14) & 0x3ff);
  uVar4 = (uint)sVar2 & 0xfffff;
  local_30 = (ulong)(uVar4 >> 10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  uVar3 = (ulong)((uint)sVar2 & 0x3ff);
  local_50.field_2._M_local_buf[0] = '\0';
  local_20 = uVar3;
  if (0x3fffffff < sVar2) {
    String::to_string<unsigned_long>(&local_78,&local_28);
    std::operator+(&bStack_98,&local_78,"G ");
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (local_58 != 0) {
    String::to_string<unsigned_long>(&local_78,&local_58);
    std::operator+(&bStack_98,&local_78,"M ");
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (0x3ff < uVar4) {
    String::to_string<unsigned_long>(&local_78,&local_30);
    std::operator+(&bStack_98,&local_78,"K ");
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (uVar3 != 0) {
    String::to_string<unsigned_long>(&bStack_98,&local_20);
    std::__cxx11::string::append((string *)&local_50);
    std::__cxx11::string::~string((string *)&bStack_98);
  }
  std::__cxx11::string::string((string *)&bStack_98,"Process",(allocator *)&local_78);
  poVar1 = Logger::out(&bStack_98);
  poVar1 = std::operator<<(poVar1,"Maximum used memory: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,(string *)&local_50);
  poVar1 = std::operator<<(poVar1,")");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void show_stats() {

            Logger::out("Process") << "Total elapsed time: " 
                                   << SystemStopwatch::now() - start_time_
                                   << "s" << std::endl;

            const size_t K=size_t(1024);
            const size_t M=K*K;
            const size_t G=K*M;
            
            size_t max_mem = Process::max_used_memory() ;
            size_t r = max_mem;
            
            size_t mem_G = r / G;
            r = r % G;
            size_t mem_M = r / M;
            r = r % M;
            size_t mem_K = r / K;
            r = r % K;
            
            std::string s;
            if(mem_G != 0) {
                s += String::to_string(mem_G)+"G ";
            }
            if(mem_M != 0) {
                s += String::to_string(mem_M)+"M ";
            }
            if(mem_K != 0) {
                s += String::to_string(mem_K)+"K ";
            }
            if(r != 0) {
                s += String::to_string(r);
            }

            Logger::out("Process") << "Maximum used memory: " 
                                   << max_mem << " (" << s << ")"
                                   << std::endl;
        }